

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O1

void __thiscall
gimage::PNMImageIO::load
          (PNMImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  unsigned_short ***pppuVar4;
  ImageU16 *pIVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  IOException *pIVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_t __n;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  void *pvVar20;
  undefined1 auStack_388 [7];
  allocator local_381;
  ulong local_380;
  long local_378;
  void *local_370;
  long local_368;
  long local_360;
  ulong local_358;
  ulong local_350;
  ulong local_348;
  ImageU16 *local_340;
  long local_338;
  long local_330;
  int depth;
  void *local_320;
  size_t local_318;
  long local_310;
  long local_308;
  pos_type local_300;
  long local_2f0;
  long height;
  long width;
  long local_2d8;
  long local_2d0;
  void *local_2c8;
  void *local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  ulong local_2a0;
  long local_298;
  long local_290;
  long maxval;
  float scale;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream in;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_228;
  uchar **ppuStack_218;
  uchar **local_210;
  uchar ***pppuStack_208;
  
  local_360 = x;
  local_340 = image;
  iVar8 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar8 == '\0') {
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_258,name,&local_381);
    std::operator+(&local_278,"Can only load PNM image (",&local_258);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_278);
    _in = (pointer)*plVar12;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_in == paVar13) {
      aStack_228._M_allocated_capacity = paVar13->_M_allocated_capacity;
      aStack_228._8_8_ = plVar12[3];
      _in = (pointer)&aStack_228;
    }
    else {
      aStack_228._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    *plVar12 = (long)paVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    gutil::IOException::IOException(pIVar11,(string *)&in);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_300 = anon_unknown_11::readPNMHeader(name,&depth,&maxval,&scale,&width,&height);
  pIVar5 = local_340;
  if ((scale != 0.0) || (NAN(scale))) {
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_258,name,&local_381);
    std::operator+(&local_278,"A float image cannot be loaded as 16 bit image (",&local_258);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_278);
    _in = (pointer)*plVar12;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_in == paVar13) {
      aStack_228._M_allocated_capacity = paVar13->_M_allocated_capacity;
      aStack_228._8_8_ = plVar12[3];
      _in = (pointer)&aStack_228;
    }
    else {
      aStack_228._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    *plVar12 = (long)paVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    gutil::IOException::IOException(pIVar11,(string *)&in);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  if (maxval < 0x100) {
    local_380 = CONCAT44(local_380._4_4_,ds);
    _in = _in & 0xffffffff00000000;
    aStack_228._M_allocated_capacity = 0;
    aStack_228._8_8_ = 0;
    ppuStack_218 = (uchar **)0x0;
    local_210 = (uchar **)0x0;
    pppuStack_208 = (uchar ***)0x0;
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,0,0,1);
    (*(this->super_BasicImageIO)._vptr_BasicImageIO[6])
              (this,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,name,
               local_380 & 0xffffffff,local_360,y,w,h);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setImageLimited<unsigned_char>
              (local_340,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
  }
  else {
    uVar16 = 1;
    if (1 < ds) {
      uVar16 = (ulong)(uint)ds;
    }
    if (w < 0) {
      w = (long)(width + uVar16 + -1) / (long)uVar16;
    }
    if (h < 0) {
      h = (long)(height + uVar16 + -1) / (long)uVar16;
    }
    local_350 = (ulong)depth;
    local_308 = h;
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize(local_340,w,h,local_350);
    lVar19 = pIVar5->n;
    lVar17 = -lVar19;
    if (0 < lVar19) {
      lVar17 = lVar19;
    }
    memset(pIVar5->pixel,0,lVar17 * 2);
    std::ifstream::ifstream(&in);
    lVar19 = *(long *)(_in + -0x18);
    *(undefined4 *)((long)&aStack_228 + lVar19 + 0xc) = 7;
    std::ios::clear((int)auStack_388 + (int)lVar19 + 0x150);
    std::ifstream::open((char *)&in,(_Ios_Openmode)name);
    lVar19 = local_308;
    iVar8 = (int)local_350;
    uVar15 = local_350 & 0xffffffff;
    local_378 = width;
    local_368 = height;
    if ((((ds < 2) && (y == 0 && local_360 == 0)) && (w == width)) && (local_308 == height)) {
      std::istream::seekg(&in,local_300._M_off,local_300._M_state);
      if (0 < local_368) {
        uVar16 = local_350 & 0xffffffff;
        lVar19 = 0;
        do {
          if (0 < local_378) {
            lVar17 = 0;
            do {
              if (0 < iVar8) {
                uVar15 = 0;
                do {
                  if (ppuStack_218 < local_210) {
                    uVar7 = (ushort)*(byte *)ppuStack_218;
                    ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                  }
                  else {
                    uVar7 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                  }
                  if (ppuStack_218 < local_210) {
                    bVar6 = *(byte *)ppuStack_218;
                    ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                  }
                  else {
                    bVar6 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                  }
                  local_340->img[uVar15][lVar19][lVar17] = (ushort)bVar6 | uVar7 << 8;
                  uVar15 = uVar15 + 1;
                } while (uVar16 != uVar15);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != local_378);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != local_368);
      }
    }
    else {
      local_358 = CONCAT44(local_358._4_4_,(int)uVar16);
      local_380 = CONCAT44(local_380._4_4_,ds);
      lVar17 = w * local_350;
      local_318 = lVar17 * 4;
      pvVar10 = operator_new(local_318);
      __n = local_318;
      local_310 = lVar17;
      if (lVar17 != 0) {
        memset(pvVar10,0,local_318);
      }
      local_370 = operator_new(__n);
      if (local_310 != 0) {
        memset(local_370,0,__n);
      }
      lVar17 = 0;
      if (-y != 0 && y < 1) {
        lVar17 = -y;
      }
      if (lVar17 < lVar19) {
        local_2b0 = 0;
        if (0 < local_360) {
          local_2b0 = local_360;
        }
        local_348 = local_358 & 0xffffffff;
        local_2b0 = local_2b0 * local_348;
        local_2b8 = local_350 * 2;
        local_338 = -local_360;
        if (-local_360 == 0 || 0 < local_360) {
          local_338 = 0;
        }
        local_2d8 = local_338 * local_350;
        local_330 = (long)(int)local_380;
        local_2c0 = (void *)((long)local_370 + local_2d8 * 4);
        local_298 = local_350 * 4;
        local_2c8 = (void *)((long)pvVar10 + local_2d8 * 4);
        local_320 = pvVar10;
        local_2d0 = y;
        local_290 = w;
        do {
          local_2a8 = (lVar17 + local_2d0) * local_348;
          pvVar10 = local_320;
          if (local_368 <= local_2a8) break;
          local_2f0 = lVar17;
          if (local_310 != 0) {
            memset(local_320,0,__n);
            memset(local_370,0,__n);
          }
          uVar16 = 0;
          do {
            if (local_368 <= (long)(uVar16 + local_2a8)) break;
            local_2a0 = uVar16;
            std::istream::seekg(&in,((uVar16 + local_2a8) * local_378 + local_2b0) * local_2b8 +
                                    local_300._M_off,local_300._M_state);
            lVar19 = local_330;
            pvVar10 = local_2c8;
            uVar16 = local_338;
            pvVar20 = local_2c0;
            if (local_338 < w) {
              do {
                uVar14 = (uVar16 + local_360) * local_348;
                if (local_378 <= (long)uVar14) break;
                lVar17 = 0;
                do {
                  if (0 < (int)local_350) {
                    uVar18 = 0;
                    do {
                      if (ppuStack_218 < local_210) {
                        uVar9 = (uint)*(byte *)ppuStack_218;
                        ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                      }
                      else {
                        local_380 = uVar16;
                        local_358 = uVar14;
                        uVar9 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                        lVar19 = local_330;
                        uVar16 = local_380;
                        uVar14 = local_358;
                      }
                      if (ppuStack_218 < local_210) {
                        bVar6 = *(byte *)ppuStack_218;
                        ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                      }
                      else {
                        local_380 = uVar16;
                        local_358 = uVar14;
                        bVar6 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                        lVar19 = local_330;
                        uVar16 = local_380;
                        uVar14 = local_358;
                      }
                      piVar1 = (int *)((long)pvVar10 + uVar18 * 4);
                      *piVar1 = *piVar1 + ((uVar9 & 0xff) << 8 | (uint)bVar6);
                      piVar1 = (int *)((long)pvVar20 + uVar18 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar18 = uVar18 + 1;
                    } while (uVar15 != uVar18);
                  }
                } while ((lVar17 + 1 < lVar19) &&
                        (lVar2 = uVar14 + lVar17, lVar17 = lVar17 + 1, lVar2 + 1 < local_378));
                uVar16 = uVar16 + 1;
                pvVar10 = (void *)((long)pvVar10 + local_298);
                w = local_290;
                pvVar20 = (void *)((long)pvVar20 + local_298);
              } while (uVar16 != local_290);
            }
            uVar16 = local_2a0 + 1;
          } while (uVar16 != local_348);
          lVar19 = local_338;
          lVar17 = local_2d8;
          if (local_338 < w) {
            do {
              if (local_378 <= (long)((local_360 + lVar19) * local_348)) break;
              if (0 < iVar8) {
                pppuVar4 = local_340->img;
                uVar16 = 0;
                do {
                  iVar3 = *(int *)((long)local_370 + uVar16 * 4 + lVar17 * 4);
                  if (0 < iVar3) {
                    pppuVar4[uVar16][local_2f0][lVar19] =
                         (unsigned_short)
                         (*(int *)((long)local_320 + uVar16 * 4 + lVar17 * 4) / iVar3);
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar15 != uVar16);
                lVar17 = lVar17 + uVar16;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 != w);
          }
          lVar17 = local_2f0 + 1;
          __n = local_318;
          pvVar10 = local_320;
        } while (lVar17 != local_308);
      }
      operator_delete(local_370);
      operator_delete(pvVar10);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
  }
  return;
}

Assistant:

void PNMImageIO::load(ImageU16 &image, const char *name, int ds, long x,
                      long y, long w, long h) const
{
  long  width, height, maxval;
  float scale;
  int   depth;
  std::istream::pos_type pos;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  pos=readPNMHeader(name, depth, maxval, scale, width, height);

  if (scale != 0)
  {
    throw gutil::IOException("A float image cannot be loaded as 16 bit image ("+std::string(name)+")");
  }

  if (maxval > 255)
  {
    ds=std::max(1, ds);

    if (w < 0)
    {
      w=(width+ds-1)/ds;
    }

    if (h < 0)
    {
      h=(height+ds-1)/ds;
    }

    image.setSize(w, h, depth);
    image.clear();

    try
    {
      std::ifstream in;
      in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      in.open(name, std::ios::binary);

      // load downscaled part?

      if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
      {
        std::valarray<ImageU16::work_t> vline(0, w*depth);
        std::valarray<int> nline(0, w*depth);

        for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
        {
          // load downscaled line

          vline=0;
          nline=0;

          for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
          {
            in.seekg(pos+static_cast<std::streamoff>((y+k)*ds+kk)*width*depth*2+
                     static_cast<std::streamoff>(std::max(0l, x))*ds*depth*2);

            std::streambuf *sb=in.rdbuf();

            long j=std::max(0l, -x)*depth;

            for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
            {
              for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
              {
                for (int d=0; d<depth; d++)
                {
                  ImageU16::store_t v;

                  v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                  v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);

                  if (image.isValidS(v))
                  {
                    vline[j+d]+=v;
                    nline[j+d]++;
                  }
                }
              }

              j+=depth;
            }
          }

          // store line into image

          long j=std::max(0l, -x)*depth;

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              if (nline[j] > 0)
              {
                image.set(i, k, d, static_cast<ImageU16::store_t>(vline[j]/nline[j]));
              }

              j++;
            }
          }
        }
      }
      else // load whole image
      {
        in.seekg(pos);
        std::streambuf *sb=in.rdbuf();

        for (long k=0; k<height; k++)
        {
          for (long i=0; i<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU16::store_t v;

              v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
              v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);

              image.set(i, k, d, v);
            }
          }
        }
      }

      in.close();
    }
    catch (const std::ios_base::failure &ex)
    {
      throw gutil::IOException(ex.what());
    }
  }
  else
  {
    ImageU8 imageu8;
    load(imageu8, name, ds, x, y, w, h);
    image.setImageLimited(imageu8);
  }
}